

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O3

void __thiscall
LASreadItemCompressed_RGB12_v2::~LASreadItemCompressed_RGB12_v2
          (LASreadItemCompressed_RGB12_v2 *this)

{
  ~LASreadItemCompressed_RGB12_v2(this);
  operator_delete(this);
  return;
}

Assistant:

LASreadItemCompressed_RGB12_v2::~LASreadItemCompressed_RGB12_v2()
{
  dec->destroySymbolModel(m_byte_used);
  dec->destroySymbolModel(m_rgb_diff_0);
  dec->destroySymbolModel(m_rgb_diff_1);
  dec->destroySymbolModel(m_rgb_diff_2);
  dec->destroySymbolModel(m_rgb_diff_3);
  dec->destroySymbolModel(m_rgb_diff_4);
  dec->destroySymbolModel(m_rgb_diff_5);
}